

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::init
          (ComputeShaderGeneratedSeparateCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *pRVar1;
  int iVar2;
  ShaderProgram *pSVar3;
  ProgramSources *pPVar4;
  TestError *pTVar5;
  string local_140;
  undefined1 local_120 [40];
  ProgramSources local_f8;
  
  if ((this->super_ComputeShaderGeneratedCase).m_computeCmd == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(&local_f8,0,0xac);
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_f8._193_8_ = 0;
    (anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_140,this,true,false,false);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_120,&local_140);
    pPVar4 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,pPVar4);
    this->m_computeCmdProgram = pSVar3;
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&local_140);
    glu::ProgramSources::~ProgramSources(&local_f8);
    ctx = (EVP_PKEY_CTX *)this->m_computeCmdProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeCmdProgram->m_program).m_info.linkOk == false) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Failed to compile command compute shader.",
                 (allocator<char> *)local_120);
      tcu::TestError::TestError(pTVar5,(string *)&local_f8);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeData == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(&local_f8,0,0xac);
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_f8._193_8_ = 0;
    (anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_140,this,false,true,false);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_120,&local_140);
    pPVar4 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,pPVar4);
    this->m_computeDataProgram = pSVar3;
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&local_140);
    glu::ProgramSources::~ProgramSources(&local_f8);
    ctx = (EVP_PKEY_CTX *)this->m_computeDataProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeDataProgram->m_program).m_info.linkOk == false) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Failed to compile data compute shader.",
                 (allocator<char> *)local_120);
      tcu::TestError::TestError(pTVar5,(string *)&local_f8);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  if ((this->super_ComputeShaderGeneratedCase).m_computeIndices == true) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    pRVar1 = ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context)->m_renderCtx;
    memset(&local_f8,0,0xac);
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_f8.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_f8._193_8_ = 0;
    (anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
              (&local_140,this,false,false,true);
    glu::ComputeSource::ComputeSource((ComputeSource *)local_120,&local_140);
    pPVar4 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_120);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar1,pPVar4);
    this->m_computeIndicesProgram = pSVar3;
    std::__cxx11::string::~string((string *)(local_120 + 8));
    std::__cxx11::string::~string((string *)&local_140);
    glu::ProgramSources::~ProgramSources(&local_f8);
    ctx = (EVP_PKEY_CTX *)this->m_computeIndicesProgram;
    glu::operator<<(((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log,(ShaderProgram *)ctx);
    if ((this->m_computeIndicesProgram->m_program).m_info.linkOk == false) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Failed to compile data compute shader.",
                 (allocator<char> *)local_120);
      tcu::TestError::TestError(pTVar5,(string *)&local_f8);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = ComputeShaderGeneratedCase::init(&this->super_ComputeShaderGeneratedCase,ctx);
  return iVar2;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::init (void)
{
	// generate cmd compute shader

	if (m_computeCmd)
	{
		m_computeCmdProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genCmdComputeSource()));
		m_testCtx.getLog() << *m_computeCmdProgram;

		if (!m_computeCmdProgram->isOk())
			throw tcu::TestError("Failed to compile command compute shader.");
	}

	// generate data compute shader

	if (m_computeData)
	{
		m_computeDataProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genDataComputeSource()));
		m_testCtx.getLog() << *m_computeDataProgram;

		if (!m_computeDataProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// generate index compute shader

	if (m_computeIndices)
	{
		m_computeIndicesProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genIndexComputeSource()));
		m_testCtx.getLog() << *m_computeIndicesProgram;

		if (!m_computeIndicesProgram->isOk())
			throw tcu::TestError("Failed to compile data compute shader.");
	}

	// init parent
	ComputeShaderGeneratedCase::init();
}